

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tqapi_cs.h
# Opt level: O1

void __thiscall AccountInfoWrap::AccountInfoWrap(AccountInfoWrap *this,AccountInfo *orig)

{
  AccountInfo *this_00;
  string *psVar1;
  
  this_00 = &this->m_orig;
  tquant::api::AccountInfo::AccountInfo(this_00,orig);
  utf8_to_utf16(&this_00->account_id,&this_00->account_id);
  this->account_id = (this->m_orig).account_id._M_dataplus._M_p;
  psVar1 = &(this->m_orig).broker;
  utf8_to_utf16(psVar1,psVar1);
  this->broker = (this->m_orig).broker._M_dataplus._M_p;
  psVar1 = &(this->m_orig).account;
  utf8_to_utf16(psVar1,psVar1);
  this->account = (this->m_orig).account._M_dataplus._M_p;
  psVar1 = &(this->m_orig).status;
  utf8_to_utf16(psVar1,psVar1);
  this->status = (this->m_orig).status._M_dataplus._M_p;
  psVar1 = &(this->m_orig).msg;
  utf8_to_utf16(psVar1,psVar1);
  this->msg = (this->m_orig).msg._M_dataplus._M_p;
  psVar1 = &(this->m_orig).account_type;
  utf8_to_utf16(psVar1,psVar1);
  this->account_type = (this->m_orig).account_type._M_dataplus._M_p;
  return;
}

Assistant:

AccountInfoWrap(const AccountInfo& orig) : m_orig(orig)
    {
        account_id   = _T( m_orig.account_id   , m_orig.account_id  );
        broker       = _T( m_orig.broker       , m_orig.broker      );
        account      = _T( m_orig.account      , m_orig.account     );
        status       = _T( m_orig.status       , m_orig.status      );
        msg          = _T( m_orig.msg          , m_orig.msg         );
        account_type = _T( m_orig.account_type , m_orig.account_type);
    }